

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeNonAtomicLoad(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  double dVar1;
  int8_t iVar2;
  byte bVar3;
  uint32_t uVar4;
  uint uVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  ulong uVar8;
  uintptr_t local_48;
  uintptr_t uStack_40;
  
  this_00 = &this->random;
  iVar2 = Random::get(this_00);
  dVar1 = log((double)(iVar2 + 1 + (uint)(iVar2 == -1)));
  dVar1 = floor(dVar1);
  pEVar6 = makePointer(this);
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  if (6 < (uint)type.id) {
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x698);
  }
  uVar8 = (ulong)dVar1;
  switch(type.id & 0xffffffff) {
  default:
    wasm::handle_unreachable
              ("invalid type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
               ,0x696);
  case 2:
    bVar3 = Random::get(this_00);
    bVar3 = bVar3 & 1;
    uVar4 = Random::upTo(this_00,3);
    if (uVar4 == 2) {
switchD_00128bc9_caseD_2:
      uVar5 = Random::pick<int,int,int>(this_00,1,2,4);
      local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
      uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
      pEVar7 = (Expression *)
               MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
      pEVar7->_id = LoadId;
      pEVar7[1].type.id = 0;
      *(undefined8 *)(pEVar7 + 2) = 0;
      *(undefined1 *)&pEVar7[2].type.id = 0;
      *(undefined1 *)&pEVar7[1]._id = BreakId;
      goto LAB_00128e1f;
    }
    if (uVar4 == 1) goto switchD_00128bc9_caseD_1;
    if (uVar4 != 0) {
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x662);
    }
switchD_00128bc9_caseD_0:
    local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar7 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
    pEVar7->_id = LoadId;
    pEVar7[1].type.id = 0;
    *(undefined8 *)(pEVar7 + 2) = 0;
    *(undefined1 *)&pEVar7[2].type.id = 0;
    *(undefined1 *)&pEVar7[1]._id = BlockId;
    *(byte *)((long)&pEVar7[1]._id + 1) = bVar3;
    pEVar7[1].type.id = uVar8 & 0xffffffff;
    *(undefined8 *)(pEVar7 + 2) = 1;
    goto LAB_00128e2e;
  case 3:
    bVar3 = Random::get(this_00);
    uVar4 = Random::upTo(this_00,4);
    if (3 < uVar4) {
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x67e);
    }
    bVar3 = bVar3 & 1;
    switch(uVar4) {
    case 0:
      goto switchD_00128bc9_caseD_0;
    case 1:
switchD_00128bc9_caseD_1:
      uVar5 = Random::pick<int,int>(this_00,1,2);
      local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
      uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
      pEVar7 = (Expression *)
               MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
      pEVar7->_id = LoadId;
      pEVar7[1].type.id = 0;
      *(undefined8 *)(pEVar7 + 2) = 0;
      *(undefined1 *)&pEVar7[2].type.id = 0;
      *(undefined1 *)&pEVar7[1]._id = IfId;
      break;
    case 2:
      goto switchD_00128bc9_caseD_2;
    case 3:
      uVar5 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
      local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
      uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
      pEVar7 = (Expression *)
               MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
      pEVar7->_id = LoadId;
      pEVar7[1].type.id = 0;
      *(undefined8 *)(pEVar7 + 2) = 0;
      *(undefined1 *)&pEVar7[2].type.id = 0;
      *(undefined1 *)&pEVar7[1]._id = LocalGetId;
    }
LAB_00128e1f:
    *(byte *)((long)&pEVar7[1]._id + 1) = bVar3;
    pEVar7[1].type.id = uVar8 & 0xffffffff;
    *(ulong *)(pEVar7 + 2) = (ulong)uVar5;
LAB_00128e2e:
    *(Expression **)(pEVar7 + 3) = pEVar6;
    goto LAB_00128e36;
  case 4:
    uVar5 = Random::pick<int,int,int>(this_00,1,2,4);
    local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar7 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
    pEVar7->_id = LoadId;
    pEVar7[1].type.id = 0;
    *(undefined8 *)(pEVar7 + 2) = 0;
    *(undefined1 *)&pEVar7[2].type.id = 0;
    *(undefined2 *)&pEVar7[1]._id = BreakId;
    break;
  case 5:
    uVar5 = Random::pick<int,int,int,int>(this_00,1,2,4,8);
    local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar7 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
    pEVar7->_id = LoadId;
    pEVar7[1].type.id = 0;
    *(undefined8 *)(pEVar7 + 2) = 0;
    *(undefined1 *)&pEVar7[2].type.id = 0;
    *(undefined2 *)&pEVar7[1]._id = LocalGetId;
    break;
  case 6:
    if (((byte)this->wasm[0x108] & 8) == 0) {
      pEVar6 = makeTrivial(this,type);
      return pEVar6;
    }
    uVar5 = Random::pick<int,int,int,int,int>(this_00,1,2,4,8,0x10);
    local_48 = *(uintptr_t *)**(long **)(this->wasm + 0x78);
    uStack_40 = ((uintptr_t *)**(long **)(this->wasm + 0x78))[1];
    pEVar7 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x158),0x48,8);
    pEVar7->_id = LoadId;
    pEVar7[1].type.id = 0;
    *(undefined8 *)(pEVar7 + 2) = 0;
    *(undefined1 *)&pEVar7[2].type.id = 0;
    *(undefined2 *)&pEVar7[1]._id = BinaryId;
  }
  pEVar7[1].type.id = uVar8 & 0xffffffff;
  *(ulong *)(pEVar7 + 2) = (ulong)uVar5;
  *(Expression **)(pEVar7 + 3) = pEVar6;
LAB_00128e36:
  (pEVar7->type).id = type.id;
  pEVar7[3].type.id = local_48;
  *(uintptr_t *)(pEVar7 + 4) = uStack_40;
  return pEVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeNonAtomicLoad(Type type) {
  auto offset = logify(get());
  auto ptr = makePointer();
  switch (type.getBasic()) {
    case Type::i32: {
      bool signed_ = get() & 1;
      switch (upTo(3)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::i64: {
      bool signed_ = get() & 1;
      switch (upTo(4)) {
        case 0:
          return builder.makeLoad(
            1, signed_, offset, 1, ptr, type, wasm.memories[0]->name);
        case 1:
          return builder.makeLoad(
            2, signed_, offset, pick(1, 2), ptr, type, wasm.memories[0]->name);
        case 2:
          return builder.makeLoad(4,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
        case 3:
          return builder.makeLoad(8,
                                  signed_,
                                  offset,
                                  pick(1, 2, 4, 8),
                                  ptr,
                                  type,
                                  wasm.memories[0]->name);
      }
      WASM_UNREACHABLE("unexpected value");
    }
    case Type::f32: {
      return builder.makeLoad(
        4, false, offset, pick(1, 2, 4), ptr, type, wasm.memories[0]->name);
    }
    case Type::f64: {
      return builder.makeLoad(
        8, false, offset, pick(1, 2, 4, 8), ptr, type, wasm.memories[0]->name);
    }
    case Type::v128: {
      if (!wasm.features.hasSIMD()) {
        return makeTrivial(type);
      }
      return builder.makeLoad(16,
                              false,
                              offset,
                              pick(1, 2, 4, 8, 16),
                              ptr,
                              type,
                              wasm.memories[0]->name);
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("invalid type");
  }
  WASM_UNREACHABLE("invalid type");
}